

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fthash.c
# Opt level: O2

FT_Error hash_init(FT_Hash hash,FT_Bool is_num,FT_Memory memory)

{
  undefined8 in_RAX;
  FT_Hashnode *ppFVar1;
  code *pcVar2;
  undefined7 in_register_00000031;
  code *pcVar3;
  bool bVar4;
  FT_Error error;
  
  error = (FT_Error)((ulong)in_RAX >> 0x20);
  hash->limit = 0x50;
  hash->size = 0xf1;
  hash->used = 0;
  bVar4 = (int)CONCAT71(in_register_00000031,is_num) == 0;
  pcVar2 = hash_num_lookup;
  if (bVar4) {
    pcVar2 = hash_str_lookup;
  }
  pcVar3 = hash_num_compare;
  if (bVar4) {
    pcVar3 = hash_str_compare;
  }
  hash->lookup = pcVar2;
  hash->compare = pcVar3;
  ppFVar1 = (FT_Hashnode *)ft_mem_realloc(memory,8,0,0xf1,(void *)0x0,&error);
  hash->table = ppFVar1;
  return error;
}

Assistant:

static FT_Error
  hash_init( FT_Hash    hash,
             FT_Bool    is_num,
             FT_Memory  memory )
  {
    FT_UInt   sz = INITIAL_HT_SIZE;
    FT_Error  error;


    hash->size  = sz;
    hash->limit = sz / 3;
    hash->used  = 0;

    if ( is_num )
    {
      hash->lookup  = hash_num_lookup;
      hash->compare = hash_num_compare;
    }
    else
    {
      hash->lookup  = hash_str_lookup;
      hash->compare = hash_str_compare;
    }

    FT_MEM_NEW_ARRAY( hash->table, sz );

    return error;
  }